

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_sptfqmr_serial.c
# Opt level: O3

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  
  prVar1 = N_VGetArrayPointer(X);
  prVar2 = N_VGetArrayPointer(Y);
  if (0 < problem_size) {
    iVar3 = 0;
    lVar4 = 0;
    do {
      dVar6 = prVar1[lVar4];
      if (NAN(dVar6)) {
        uVar5 = 1;
      }
      else {
        uVar5 = (uint)(ABS(dVar6) * tol * 5.0 < ABS(dVar6 - prVar2[lVar4]));
      }
      iVar3 = iVar3 + uVar5;
      lVar4 = lVar4 + 1;
    } while (problem_size != lVar4);
    if (iVar3 != 0) {
      if (problem_size < 1) {
        dVar6 = 0.0;
      }
      else {
        lVar4 = 0;
        dVar7 = 0.0;
        do {
          dVar6 = ABS((prVar1[lVar4] - prVar2[lVar4]) / prVar1[lVar4]);
          if (dVar6 <= dVar7) {
            dVar6 = dVar7;
          }
          lVar4 = lVar4 + 1;
          dVar7 = dVar6;
        } while (problem_size != lVar4);
      }
      printf("check err failure: maxerr = %g (tol = %g)\n",dVar6);
      return 1;
    }
  }
  return 0;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  
  /* check vector data */
  for(i=0; i<problem_size; i++)
    failure += FNEQ(Xdata[i], Ydata[i], FIVE*tol*SUNRabs(Xdata[i]));

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < problem_size; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i])/SUNRabs(Xdata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, FIVE*tol);
    return(1);
  }
  else
    return(0);
}